

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  byte bVar1;
  int iVar2;
  CURLcode CVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  char *pcVar6;
  long lVar7;
  Curl_send_buffer *pCVar8;
  undefined7 in_register_00000031;
  curl_slist *h [2];
  long local_60;
  Curl_send_buffer *local_58;
  curl_slist *local_50;
  Curl_send_buffer *local_40;
  Curl_easy *local_38;
  
  local_40 = req_buffer;
  local_38 = conn->data;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    if (((conn->bits).httpproxy == true) && ((conn->bits).tunnel_proxy == false)) {
      local_58 = (Curl_send_buffer *)(local_38->set).headers;
      local_60 = 1;
      if ((local_38->set).sep_headers == true) {
        local_50 = (local_38->set).proxyheaders;
        local_60 = 2;
      }
      goto LAB_0011931f;
    }
LAB_00119309:
    local_58 = (Curl_send_buffer *)(local_38->set).headers;
  }
  else {
    if ((local_38->set).sep_headers != true) goto LAB_00119309;
    local_58 = (Curl_send_buffer *)(local_38->set).proxyheaders;
  }
  local_60 = 1;
LAB_0011931f:
  lVar7 = 0;
  do {
    for (pCVar8 = (&local_58)[lVar7]; pCVar8 != (Curl_send_buffer *)0x0;
        pCVar8 = (Curl_send_buffer *)pCVar8->size_max) {
      pcVar6 = pCVar8->buffer;
      pbVar4 = (byte *)strchr(pcVar6,0x3a);
      if (pbVar4 == (byte *)0x0) {
        pcVar6 = strchr(pcVar6,0x3b);
        if (pcVar6 != (char *)0x0) {
          do {
            bVar1 = pcVar6[1];
            if ((ulong)bVar1 == 0) {
              if (*pcVar6 == ';') {
                *pcVar6 = ':';
                pcVar6 = pCVar8->buffer;
                goto LAB_0011947e;
              }
              break;
            }
            pcVar6 = pcVar6 + 1;
            ppuVar5 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        }
      }
      else {
        do {
          pbVar4 = pbVar4 + 1;
          bVar1 = *pbVar4;
          if ((ulong)bVar1 == 0) goto LAB_00119489;
          ppuVar5 = __ctype_b_loc();
        } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        if ((conn->allocptr).host != (char *)0x0) {
          iVar2 = Curl_raw_nequal("Host:",pcVar6,5);
          if (iVar2 != 0) goto LAB_00119489;
          pcVar6 = pCVar8->buffer;
        }
        if ((local_38->set).httpreq == HTTPREQ_POST_FORM) {
          iVar2 = Curl_raw_nequal("Content-Type:",pcVar6,0xd);
          if (iVar2 != 0) goto LAB_00119489;
          pcVar6 = pCVar8->buffer;
        }
        if ((conn->bits).authneg == true) {
          iVar2 = Curl_raw_nequal("Content-Length",pcVar6,0xe);
          if (iVar2 != 0) goto LAB_00119489;
          pcVar6 = pCVar8->buffer;
        }
        if ((conn->allocptr).te != (char *)0x0) {
          iVar2 = Curl_raw_nequal("Connection",pcVar6,10);
          if (iVar2 != 0) goto LAB_00119489;
          pcVar6 = pCVar8->buffer;
        }
LAB_0011947e:
        CVar3 = Curl_add_bufferf(local_40,"%s\r\n",pcVar6);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
      }
LAB_00119489:
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == local_60) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists=1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i=0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      ptr = strchr(headers->data, ':');
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr) {
          /* only send this if the contents was non-blank */

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection", headers->data))
            ;
          else {
            CURLcode result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                               headers->data);
            if(result)
              return result;
          }
        }
      }
      else {
        ptr = strchr(headers->data, ';');
        if(ptr) {

          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
          }
          else {
            if(*(--ptr) == ';') {
              CURLcode result;

              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                        headers->data);
              if(result)
                return result;
            }
          }
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}